

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAttributeTranslation.cpp
# Opt level: O0

void printObject(Builder *b)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  uint8_t *start;
  ostream *poVar2;
  ostream *poVar3;
  ValueLength VVar4;
  void *pvVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  ObjectPair *it;
  default_sentinel_t __end1;
  ObjectIterator __begin1;
  ObjectIterator *__range1;
  Slice s;
  Slice *in_stack_ffffffffffffff08;
  ValueType type;
  Builder *in_stack_ffffffffffffff10;
  ObjectIterator *in_stack_ffffffffffffff18;
  Slice in_stack_ffffffffffffff20;
  Options *in_stack_ffffffffffffff40;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff48;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffff58;
  ObjectPair local_80;
  ObjectPair *local_70;
  ObjectIterator local_60;
  uint8_t *local_40;
  ObjectIterator local_38;
  ObjectIterator *local_18;
  Slice local_10 [2];
  
  start = arangodb::velocypack::Builder::start(in_stack_ffffffffffffff10);
  arangodb::velocypack::Slice::Slice(local_10,start);
  std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar2 = arangodb::velocypack::operator<<
                     ((ostream *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  type = (ValueType)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Type: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::type
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
             in_stack_ffffffffffffff10);
  poVar3 = operator<<((ostream *)in_stack_ffffffffffffff10,type);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  VVar4 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                     in_stack_ffffffffffffff10);
  pvVar5 = (void *)std::ostream::operator<<(poVar3,VVar4);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Members: ");
  VVar4 = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::length(in_stack_ffffffffffffff58);
  pvVar5 = (void *)std::ostream::operator<<(poVar3,VVar4);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Iterating Object members:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_40 = local_10[0]._start;
  arangodb::velocypack::ObjectIterator::ObjectIterator
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
             SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
  local_18 = &local_38;
  arangodb::velocypack::ObjectIterator::begin(&local_60,local_18);
  arangodb::velocypack::ObjectIterator::end(local_18);
  while( true ) {
    bVar1 = arangodb::velocypack::ObjectIterator::operator==(&local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_80 = arangodb::velocypack::ObjectIterator::operator*
                         ((ObjectIterator *)in_stack_ffffffffffffff40);
    local_70 = &local_80;
    std::operator<<((ostream *)&std::cout,"key: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    stringView((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)poVar2);
    __str._M_str = (char *)in_stack_ffffffffffffff20._start;
    __str._M_len = (size_t)in_stack_ffffffffffffff18;
    pbVar6 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             in_stack_ffffffffffffff10,__str);
    in_stack_ffffffffffffff10 = (Builder *)std::operator<<(pbVar6,", value: ");
    in_stack_ffffffffffffff18 = (ObjectIterator *)&stack0xffffffffffffff50;
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    toJson_abi_cxx11_(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff20._start =
         (uint8_t *)
         std::operator<<((ostream *)in_stack_ffffffffffffff10,(string *)in_stack_ffffffffffffff18);
    std::ostream::operator<<
              (in_stack_ffffffffffffff20._start,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff10);
    arangodb::velocypack::ObjectIterator::operator++((ObjectIterator *)in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

static void printObject(Builder const& b) {
  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the object members
  // the attribute name translator works transparently
  std::cout << "Iterating Object members:" << std::endl;
  for (auto const& it : ObjectIterator(s, /*useSequentialIteration*/ true)) {
    std::cout << "key: " << it.key.stringView()
              << ", value: " << it.value.toJson() << std::endl;
  }
}